

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_revisions(lyout *out,lys_revision *rev,uint8_t rev_size,int *first)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  long lVar2;
  int local_34 [2];
  int f;
  
  if ((int)CONCAT71(in_register_00000011,rev_size) != 0) {
    ly_print(out,"%s\"revision\":{",",");
    lVar2 = 0;
    do {
      pcVar1 = ",";
      if (lVar2 == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s\"%s\":{",pcVar1,rev->date + lVar2);
      local_34[0] = 1;
      jsons_print_text(out,"description","text",*(char **)(rev->date + lVar2 + 0x18),1,local_34);
      jsons_print_text(out,"reference","text",*(char **)(rev->date + lVar2 + 0x20),1,local_34);
      ly_print(out,"}");
      lVar2 = lVar2 + 0x28;
    } while ((ulong)rev_size * 0x28 != lVar2);
    ly_print(out,"}");
  }
  return;
}

Assistant:

static void
jsons_print_revisions(struct lyout *out, const struct lys_revision *rev, uint8_t rev_size, int *first)
{
    int i, f;

    if (!rev_size) {
        return;
    }

    ly_print(out, "%s\"revision\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < rev_size; ++i) {
        ly_print(out, "%s\"%s\":{", i ? "," : "", rev[i].date);
        f = 1;
        jsons_print_text(out, "description", "text", rev[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", rev[i].ref, 1, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}